

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O0

int loader_impl_destroy_type_map_cb_iterate
              (set s,set_key key,set_value val,set_cb_iterate_args args)

{
  long in_RDX;
  type t;
  uint local_4;
  
  if (in_RDX != 0) {
    type_destroy((type_conflict)0x132854);
  }
  local_4 = (uint)(in_RDX == 0);
  return local_4;
}

Assistant:

int loader_impl_destroy_type_map_cb_iterate(set s, set_key key, set_value val, set_cb_iterate_args args)
{
	(void)s;
	(void)key;
	(void)args;

	if (val != NULL)
	{
		type t = val;

		type_destroy(t);

		return 0;
	}

	return 1;
}